

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# separable_info.c
# Opt level: O1

double * inform_local_separable_info
                   (int *srcs,int *dest,size_t l,size_t n,size_t m,int b,size_t k,double *si,
                   inform_error *err)

{
  _Bool _Var1;
  double *__ptr;
  double *te;
  long lVar2;
  long lVar3;
  size_t sVar4;
  
  if (l == 0) {
    if (err != (inform_error *)0x0) {
      *err = INFORM_ENOSOURCES;
    }
  }
  else {
    __ptr = inform_local_active_info(dest,n,m,b,k,si,err);
    _Var1 = inform_failed(err);
    if (!_Var1) {
      lVar3 = (m - k) * n;
      te = (double *)malloc(lVar3 * 8);
      if (te == (double *)0x0) {
        if (si == (double *)0x0) {
          free(__ptr);
        }
        if (err == (inform_error *)0x0) {
          return (double *)0x0;
        }
        *err = INFORM_ENOMEM;
        return (double *)0x0;
      }
      sVar4 = 0;
      while( true ) {
        inform_local_transfer_entropy(srcs,dest,(int *)0x0,0,n,m,b,k,te,err);
        _Var1 = inform_failed(err);
        if (_Var1) break;
        if (lVar3 != 0) {
          lVar2 = 0;
          do {
            __ptr[lVar2] = te[lVar2] + __ptr[lVar2];
            lVar2 = lVar2 + 1;
          } while (lVar3 - lVar2 != 0);
        }
        sVar4 = sVar4 + 1;
        srcs = srcs + m * n;
        if (sVar4 == l) {
          free(te);
          return __ptr;
        }
      }
      free(te);
    }
    if (si == (double *)0x0) {
      free(__ptr);
    }
  }
  return (double *)0x0;
}

Assistant:

double *inform_local_separable_info(int const *srcs, int const *dest,
    size_t l, size_t n, size_t m, int b, size_t k, double *si,
    inform_error *err)
{
    if (l < 1) INFORM_ERROR_RETURN(err, INFORM_ENOSOURCES, NULL);

    bool allocated_si = (si == NULL);

    si = inform_local_active_info(dest, n, m, b, k, si, err);
    if (inform_failed(err))
    {
        if (allocated_si) free(si);
        return NULL;
    }

    const size_t N = n * (m - k);
    double *te = malloc(n * (m - k) * sizeof(double));
    if (te == NULL)
    {
        if (allocated_si) free(si);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }

    for (size_t i = 0; i < l; ++i, srcs += n*m)
    {
        inform_local_transfer_entropy(srcs, dest, NULL, 0, n, m, b, k, te, err);
        if (inform_failed(err))
        {
            free(te);
            if (allocated_si) free(si);
            return NULL;
        }
        for (size_t j = 0; j < N; ++j) si[j] += te[j];
    }

    free(te);

    return si;
}